

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.hpp
# Opt level: O0

void __thiscall
cmdline::parser::add<std::__cxx11::string,cmdline::default_reader<std::__cxx11::string>>
          (parser *this,key_type *name,char short_name,undefined8 desc,byte need,string *def)

{
  byte bVar1;
  char cVar2;
  key_type *pkVar3;
  size_type sVar4;
  cmdline_error *this_00;
  option_with_value_with_reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::default_reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *poVar5;
  mapped_type *ppoVar6;
  string local_90 [35];
  undefined1 local_6d;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *def_local;
  undefined8 uStack_30;
  bool need_local;
  string *desc_local;
  key_type *pkStack_20;
  char short_name_local;
  string *name_local;
  parser *this_local;
  
  def_local._7_1_ = need & 1;
  local_40 = def;
  uStack_30 = desc;
  desc_local._7_1_ = short_name;
  pkStack_20 = name;
  name_local = (string *)this;
  sVar4 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
          ::count(&this->options,name);
  if (sVar4 != 0) {
    local_6d = 1;
    this_00 = (cmdline_error *)__cxa_allocate_exception(0x28);
    std::operator+(&local_60,"multiple definition: ",pkStack_20);
    cmdline_error::cmdline_error(this_00,&local_60);
    local_6d = 0;
    __cxa_throw(this_00,&cmdline_error::typeinfo,cmdline_error::~cmdline_error);
  }
  poVar5 = (option_with_value_with_reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::default_reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)operator_new(0xa0);
  pkVar3 = pkStack_20;
  cVar2 = desc_local._7_1_;
  bVar1 = def_local._7_1_;
  std::__cxx11::string::string(local_90,def);
  option_with_value_with_reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::default_reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::option_with_value_with_reader(poVar5,pkVar3,(int)cVar2,bVar1 & 1,local_90,uStack_30);
  ppoVar6 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
            ::operator[](&this->options,pkStack_20);
  *ppoVar6 = (mapped_type)poVar5;
  std::__cxx11::string::~string(local_90);
  ppoVar6 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
            ::operator[](&this->options,pkStack_20);
  std::vector<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>::
  push_back(&this->ordered,ppoVar6);
  return;
}

Assistant:

void add(const std::string &name, char short_name = 0,
           const std::string &desc = "", bool need = true, const T def = T(),
           F reader = F()) {
    if (options.count(name))
      throw cmdline_error("multiple definition: " + name);
    options[name] = new option_with_value_with_reader<T, F>(
        name, short_name, need, def, desc, reader);
    ordered.push_back(options[name]);
  }